

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringToFile.cpp
# Opt level: O0

ComparisonStatusFlags __thiscall
Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::operator()
          (Comparator<Corrade::TestSuite::Compare::StringToFile> *this,StringView actualContents,
          StringView filename)

{
  bool bVar1;
  byte bVar2;
  State *pSVar3;
  type *this_00;
  ComparisonStatusFlags local_b9;
  anon_union_24_2_2c69c8ed_for_String_0 local_b8;
  char *pcStack_a0;
  String local_98;
  undefined4 local_7c;
  ComparisonStatusFlags local_75 [13];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined1 local_58 [8];
  Optional<Corrade::Containers::String> expectedContents;
  Comparator<Corrade::TestSuite::Compare::StringToFile> *this_local;
  StringView filename_local;
  StringView actualContents_local;
  
  actualContents_local._data = (char *)actualContents._sizePlusFlags;
  expectedContents._24_8_ = this;
  pSVar3 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>
           ::operator->(&this->_state);
  (pSVar3->filename)._data = filename._data;
  (pSVar3->filename)._sizePlusFlags = filename._sizePlusFlags;
  pSVar3 = Containers::
           Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>
           ::operator->(&this->_state);
  (pSVar3->actualContents)._data = actualContents._data;
  (pSVar3->actualContents)._sizePlusFlags = (size_t)actualContents_local._data;
  this_local._0_4_ = filename._data._0_4_;
  this_local._4_4_ = filename._data._4_4_;
  filename_local._data._0_4_ = (undefined4)filename._sizePlusFlags;
  filename_local._data._4_4_ = filename._sizePlusFlags._4_4_;
  local_68 = this_local._0_4_;
  uStack_64 = this_local._4_4_;
  uStack_60 = filename_local._data._0_4_;
  uStack_5c = filename_local._data._4_4_;
  Corrade::Utility::Path::readString((Optional *)local_58,filename._data,filename._sizePlusFlags);
  bVar1 = Containers::Optional::operator_cast_to_bool((Optional *)local_58);
  if (bVar1) {
    this_00 = Utility::move<Corrade::Containers::Optional<Corrade::Containers::String>&>
                        ((Optional<Corrade::Containers::String> *)local_58);
    Containers::Optional<Corrade::Containers::String>::operator*(&local_98,this_00);
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>
             ::operator->(&this->_state);
    Corrade::Containers::String::operator=(&pSVar3->expectedContents,&local_98);
    Corrade::Containers::String::~String(&local_98);
    pSVar3 = Containers::
             Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>
             ::operator->(&this->_state);
    pSVar3->result = Success;
    pcStack_a0 = actualContents_local._data;
    local_b8._large.size = (size_t)actualContents._data;
    Containers::
    Pointer<Corrade::TestSuite::Comparator<Corrade::TestSuite::Compare::StringToFile>::State>::
    operator->(&this->_state);
    Corrade::Containers::BasicStringView<char_const>::BasicStringView((String *)&local_b8._small);
    bVar2 = Corrade::Containers::operator==
                      (local_b8._large.size,pcStack_a0,local_b8._large.data,local_b8._large.deleter)
    ;
    if ((bVar2 & 1) == 0) {
      Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
                (&local_b9,Failed);
      actualContents_local._sizePlusFlags._7_1_ = operator|(Diagnostic,local_b9);
    }
    else {
      Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
                ((EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)__xff_> *)
                 ((long)&actualContents_local._sizePlusFlags + 7));
    }
  }
  else {
    Containers::EnumSet<Corrade::TestSuite::ComparisonStatusFlag,_(unsigned_char)'\xff'>::EnumSet
              (local_75,Failed);
    actualContents_local._sizePlusFlags._7_1_ = operator|(Diagnostic,local_75[0]);
  }
  local_7c = 1;
  Containers::Optional<Corrade::Containers::String>::~Optional
            ((Optional<Corrade::Containers::String> *)local_58);
  return (ComparisonStatusFlags)actualContents_local._sizePlusFlags._7_1_;
}

Assistant:

ComparisonStatusFlags Comparator<Compare::StringToFile>::operator()(const Containers::StringView actualContents, const Containers::StringView filename) {
    _state->filename = filename;

    /* Save the actual file contents before the expected so if the expected
       file can't be read, we can still save actual file contents */
    _state->actualContents = actualContents;

    /* If this fails, we already have the actual contents so we can save them */
    Containers::Optional<Containers::String> expectedContents = Utility::Path::readString(filename);
    if(!expectedContents)
        return ComparisonStatusFlag::Diagnostic|ComparisonStatusFlag::Failed;

    _state->expectedContents = *Utility::move(expectedContents);
    _state->result = Result::Success;

    return actualContents == _state->expectedContents ? ComparisonStatusFlags{} :
        ComparisonStatusFlag::Diagnostic|ComparisonStatusFlag::Failed;
}